

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerInlineeEnd(Lowerer *this,Instr *instr)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  SymOpnd *dst;
  IntConstOpnd *src;
  Func *this_02;
  
  bVar3 = Func::IsInlinee(instr->m_func);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3952,"(instr->m_func->IsInlinee())","instr->m_func->IsInlinee()");
    if (!bVar3) goto LAB_005bd9f0;
    *puVar4 = 0;
  }
  if (this->m_func->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3953,"(m_func->IsTopFunc())","m_func->IsTopFunc()");
    if (!bVar3) {
LAB_005bd9f0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_02 = instr->m_func;
  if ((this_02->field_0x241 & 0x80) == 0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,DeadStorePhase,sourceContextId,functionId)
    ;
    if (!bVar3) goto LAB_005bd9a6;
    this_02 = instr->m_func;
  }
  dst = Func::GetInlineeOpndAtOffset(this_02,0);
  src = IR::IntConstOpnd::New(0,TyInt64,instr->m_func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,true);
LAB_005bd9a6:
  uVar1 = *(uint *)&instr->m_func->field_0x240;
  if (((uVar1 & 2) == 0) &&
     (((uVar1 & 4) != 0 || ((*(uint *)&instr->m_func->parentFunc->field_0x240 & 2) == 0)))) {
    IR::Instr::Remove(instr);
    return;
  }
  IR::Instr::FreeSrc1(instr);
  return;
}

Assistant:

void
Lowerer::LowerInlineeEnd(IR::Instr *instr)
{
    Assert(instr->m_func->IsInlinee());
    Assert(m_func->IsTopFunc());

    // No need to emit code if the function wasn't marked as having implicit calls or bailout.  Dead-Store should have removed inline overhead.
    if (instr->m_func->GetHasImplicitCalls() || PHASE_OFF(Js::DeadStorePhase, this->m_func))
    {
        Lowerer::InsertMove(instr->m_func->GetInlineeArgCountSlotOpnd(),
                                IR::IntConstOpnd::New(0, TyMachReg, instr->m_func),
                                instr);
    }

    // Keep InlineeEnd around as it is used by register allocator, if we have optimized the arguments stack
    if (instr->m_func->m_hasInlineArgsOpt || (instr->m_func->GetParentFunc()->m_hasInlineArgsOpt && !instr->m_func->m_hasInlineOverheadRemoved))
    {
        instr->FreeSrc1();
    }
    else
    {
        instr->Remove();
    }
}